

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O2

string * __thiscall
lsim::BoolProperty::value_as_string_abi_cxx11_(string *__return_storage_ptr__,BoolProperty *this)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = "false";
  if (this->m_value != false) {
    pcVar1 = "true";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string BoolProperty::value_as_string() const {
    return (m_value) ? "true" : "false";
}